

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

char * google::protobuf::Append4(char *out,AlphaNum *x1,AlphaNum *x2,AlphaNum *x3,AlphaNum *x4)

{
  size_t sVar1;
  char *pcVar2;
  
  memcpy(out,x1->piece_data_,x1->piece_size_);
  pcVar2 = out + x1->piece_size_;
  memcpy(pcVar2,x2->piece_data_,x2->piece_size_);
  pcVar2 = pcVar2 + x2->piece_size_;
  memcpy(pcVar2,x3->piece_data_,x3->piece_size_);
  sVar1 = x3->piece_size_;
  memcpy(pcVar2 + sVar1,x4->piece_data_,x4->piece_size_);
  return pcVar2 + sVar1 + x4->piece_size_;
}

Assistant:

static char *Append4(char *out,
                     const AlphaNum &x1, const AlphaNum &x2,
                     const AlphaNum &x3, const AlphaNum &x4) {
  memcpy(out, x1.data(), x1.size());
  out += x1.size();

  memcpy(out, x2.data(), x2.size());
  out += x2.size();

  memcpy(out, x3.data(), x3.size());
  out += x3.size();

  memcpy(out, x4.data(), x4.size());
  return out + x4.size();
}